

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_client::send_retry
          (asio_rpc_client *this,ptr<asio_rpc_client> *self,ptr<asio::steady_timer> *timer,
          ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,error_code *err)

{
  element_type *peVar1;
  int iVar2;
  char *pcVar3;
  ptr<resp_msg> rsp;
  ptr<rpc_exception> except;
  undefined1 local_100 [8];
  strfmt<200> local_f8;
  
  if (err->_M_value == 0) {
    if ((this->num_send_fails_).super___atomic_base<unsigned_long>._M_i < 6) {
      (*(this->super_rpc_client)._vptr_rpc_client[2])(this,req,when_done,send_timeout_ms);
      return;
    }
    if (err->_M_value != 0) goto LAB_0021a818;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_0021a87e;
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (iVar2 < 2) goto LAB_0021a87e;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar3 = "disabled";
    if (this->ssl_enabled_ != false) {
      pcVar3 = "enabled";
    }
    msg_if_given_abi_cxx11_
              ((string *)(local_100 + 8),"connection to %s:%s timeout (SSL %s)",
               (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p,pcVar3);
    (**(code **)(*(long *)peVar1 + 0x40))
              (peVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"send_retry",0x3d2,(string *)(local_100 + 8));
  }
  else {
LAB_0021a818:
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_0021a87e;
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (iVar2 < 2) goto LAB_0021a87e;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)(local_100 + 8),"error happened during async wait: %d",
               (ulong)(uint)err->_M_value);
    (**(code **)(*(long *)peVar1 + 0x40))
              (peVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"send_retry",0x3ce,(string *)(local_100 + 8));
  }
  std::__cxx11::string::~string((string *)(local_100 + 8));
LAB_0021a87e:
  LOCK();
  (this->abandoned_)._M_base._M_i = true;
  UNLOCK();
  rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.fmt_ = "timeout while connecting to %s";
  local_100 = (undefined1  [8])
              strfmt<200>::fmt<char_const*>
                        ((strfmt<200> *)(local_100 + 8),(this->host_)._M_dataplus._M_p);
  std::make_shared<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
            ((char **)&except,(shared_ptr<nuraft::req_msg> *)local_100);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  operator()(when_done,&rsp,&except);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void send_retry( ptr<asio_rpc_client> self,
                     ptr<asio::steady_timer> timer,
                     ptr<req_msg>& req,
                     rpc_handler& when_done,
                     uint64_t send_timeout_ms,
                     const ERROR_CODE& err )
    {
        if ( err || num_send_fails_ >= SEND_RETRY_MAX ) {
            if (err) {
                p_er("error happened during async wait: %d", err.value());
            } else {
                p_er( "connection to %s:%s timeout (SSL %s)",
                      host_.c_str(), port_.c_str(),
                      ( ssl_enabled_ ? "enabled" : "disabled" ) );
            }
            abandoned_= true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
               ( cs_new<rpc_exception>
                       ( lstrfmt("timeout while connecting to %s")
                                .fmt(host_.c_str()),
                         req ) );
            when_done(rsp, except);
            return;
        }
        send(req, when_done, send_timeout_ms);
    }